

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_block(SyntaxAnalyze *this)

{
  bool bVar1;
  
  match_one_word(this,LBRACE);
  this->layer_num = this->layer_num + 1;
  while( true ) {
    bVar1 = try_word(this,1,RBRACE);
    if (bVar1) break;
    gm_block_item(this);
  }
  out_layer(this);
  match_one_word(this,RBRACE);
  return;
}

Assistant:

void SyntaxAnalyze::gm_block() {
  match_one_word(Token::LBRACE);
  in_layer();

  while (!try_word(1, Token::RBRACE)) {
    gm_block_item();
  }

  out_layer();
  match_one_word(Token::RBRACE);
}